

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int cmCTest::GetTestModelFromString(char *str)

{
  bool bVar1;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string rstr;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local._4_4_ = 0;
  }
  else {
    rstr.field_2._8_8_ = str;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,str,&local_59);
    cmsys::SystemTools::LowerCase((string *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,5ul>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                       ,(char (*) [5])"cont");
    if (bVar1) {
      str_local._4_4_ = 2;
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,5ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38,(char (*) [5])"nigh");
      if (bVar1) {
        str_local._4_4_ = 1;
      }
      else {
        str_local._4_4_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  return str_local._4_4_;
}

Assistant:

int cmCTest::GetTestModelFromString(const char* str)
{
  if (!str) {
    return cmCTest::EXPERIMENTAL;
  }
  std::string rstr = cmSystemTools::LowerCase(str);
  if (cmHasLiteralPrefix(rstr, "cont")) {
    return cmCTest::CONTINUOUS;
  }
  if (cmHasLiteralPrefix(rstr, "nigh")) {
    return cmCTest::NIGHTLY;
  }
  return cmCTest::EXPERIMENTAL;
}